

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_reservoir_sample.cpp
# Opt level: O1

void __thiscall
duckdb::SampleGlobalSinkState::SampleGlobalSinkState
          (SampleGlobalSinkState *this,Allocator *allocator,SampleOptions *options)

{
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> _Var1;
  idx_t iVar2;
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> this_00;
  int64_t val;
  unsigned_long sample_count;
  double percentage;
  
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.can_block._M_base._M_i = true;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __align = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 0x10) = 0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__next = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_GlobalSinkState).state = READY;
  (this->super_GlobalSinkState)._vptr_GlobalSinkState =
       (_func_int **)&PTR__SampleGlobalSinkState_019c8ce8;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->sample).
  super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
  super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>.
  super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl = (BlockingSample *)0x0;
  if (options->is_percentage == true) {
    percentage = Value::GetValue<double>(&options->sample_size);
    if ((percentage == 0.0) && (!NAN(percentage))) {
      return;
    }
    iVar2 = optional_idx::GetIndex(&options->seed);
    this_00._M_head_impl = (BlockingSample *)operator_new(0x60);
    ReservoirSamplePercentage::ReservoirSamplePercentage
              ((ReservoirSamplePercentage *)this_00._M_head_impl,allocator,percentage,iVar2);
  }
  else {
    val = Value::GetValue<long>(&options->sample_size);
    sample_count = NumericCastImpl<unsigned_long,_long,_false>::Convert(val);
    if (sample_count == 0) {
      return;
    }
    iVar2 = optional_idx::GetIndex(&options->seed);
    this_00._M_head_impl = (BlockingSample *)operator_new(0x58);
    ReservoirSample::ReservoirSample
              ((ReservoirSample *)this_00._M_head_impl,allocator,sample_count,iVar2);
  }
  _Var1._M_head_impl =
       (this->sample).
       super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
       super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
       .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl;
  (this->sample).
  super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
  super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>.
  super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl = this_00._M_head_impl;
  if (_Var1._M_head_impl == (BlockingSample *)0x0) {
    return;
  }
  (**(code **)((long)(_Var1._M_head_impl)->_vptr_BlockingSample + 8))();
  return;
}

Assistant:

explicit SampleGlobalSinkState(Allocator &allocator, SampleOptions &options) {
		if (options.is_percentage) {
			auto percentage = options.sample_size.GetValue<double>();
			if (percentage == 0) {
				return;
			}
			sample = make_uniq<ReservoirSamplePercentage>(allocator, percentage,
			                                              static_cast<int64_t>(options.seed.GetIndex()));
		} else {
			auto size = NumericCast<idx_t>(options.sample_size.GetValue<int64_t>());
			if (size == 0) {
				return;
			}
			sample = make_uniq<ReservoirSample>(allocator, size, static_cast<int64_t>(options.seed.GetIndex()));
		}
	}